

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

bool __thiscall dg::llvmdg::DGCallGraphImpl::calls(DGCallGraphImpl *this,Function *F,Function *what)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  FuncNode *this_00;
  FuncNode *x;
  Function *local_30;
  Function *local_28;
  
  local_30 = what;
  local_28 = F;
  iVar3 = std::
          _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>_>
          ::find(&(this->_mapping)._M_t,&local_28);
  p_Var1 = &(this->_mapping)._M_t._M_impl.super__Rb_tree_header;
  if (((_Rb_tree_header *)iVar3._M_node != p_Var1) &&
     (iVar4 = std::
              _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>_>
              ::find(&(this->_mapping)._M_t,&local_30), (_Rb_tree_header *)iVar4._M_node != p_Var1))
  {
    this_00 = GenericCallGraph<dg::pta::PSNode_*>::get
                        (this->_cg,(PSNode **)&iVar3._M_node[1]._M_parent);
    x = GenericCallGraph<dg::pta::PSNode_*>::get(this->_cg,(PSNode **)&iVar4._M_node[1]._M_parent);
    if (x != (FuncNode *)0x0 && this_00 != (FuncNode *)0x0) {
      bVar2 = GenericCallGraph<dg::pta::PSNode_*>::FuncNode::calls(this_00,x);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool calls(const llvm::Function *F, const llvm::Function *what) override {
        auto it = _mapping.find(F);
        if (it == _mapping.end())
            return false;
        auto it2 = _mapping.find(what);
        if (it2 == _mapping.end())
            return false;
        const auto *fn1 = _cg.get(it->second);
        const auto *fn2 = _cg.get(it2->second);
        if (fn1 && fn2) {
            return fn1->calls(fn2);
        }
        return false;
    }